

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O1

void __thiscall
gl4cts::DirectStateAccess::Textures::StorageAndSubImageTest::StorageAndSubImageTest
          (StorageAndSubImageTest *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"textures_storage_and_subimage",
             "Texture Storage and SubImage Test");
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_02137ee0;
  this->m_fbo = 0;
  this->m_rbo = 0;
  this->m_po = 0;
  this->m_to = 0;
  this->m_vao = 0;
  return;
}

Assistant:

StorageAndSubImageTest::StorageAndSubImageTest(deqp::Context& context)
	: deqp::TestCase(context, "textures_storage_and_subimage", "Texture Storage and SubImage Test")
	, m_fbo(0)
	, m_rbo(0)
	, m_po(0)
	, m_to(0)
	, m_vao(0)
{
	/* Intentionally left blank. */
}